

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_asn1.cc
# Opt level: O2

size_t ECDSA_SIG_max_len(size_t order_len)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  
  sVar1 = der_len_len(order_len + 1);
  uVar3 = sVar1 + order_len + 2;
  if (uVar3 < order_len || (long)uVar3 < 0) {
    sVar1 = 0;
  }
  else {
    sVar1 = der_len_len(uVar3 * 2);
    uVar2 = sVar1 + uVar3 * 2 + 1;
    sVar1 = 0;
    if (uVar3 * 2 <= uVar2) {
      sVar1 = uVar2;
    }
  }
  return sVar1;
}

Assistant:

size_t ECDSA_SIG_max_len(size_t order_len) {
  // Compute the maximum length of an |order_len| byte integer. Defensively
  // assume that the leading 0x00 is included.
  size_t integer_len = 1 /* tag */ + der_len_len(order_len + 1) + 1 + order_len;
  if (integer_len < order_len) {
    return 0;
  }
  // An ECDSA signature is two INTEGERs.
  size_t value_len = 2 * integer_len;
  if (value_len < integer_len) {
    return 0;
  }
  // Add the header.
  size_t ret = 1 /* tag */ + der_len_len(value_len) + value_len;
  if (ret < value_len) {
    return 0;
  }
  return ret;
}